

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O2

Vector3f pbrt::EqualAreaSquareToSphere(Point2f *p)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  Float x;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Float FVar10;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar11 [64];
  uint dst;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  Vector3f VVar14;
  undefined1 extraout_var [60];
  
  fVar1 = (p->super_Tuple2<pbrt::Point2,_float>).x;
  if ((((0.0 <= fVar1) && (fVar1 <= 1.0)) &&
      (fVar2 = (p->super_Tuple2<pbrt::Point2,_float>).y, 0.0 <= fVar2)) && (fVar2 <= 1.0)) {
    auVar9 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar2),0x10);
    auVar8._8_4_ = 0x40000000;
    auVar8._0_8_ = 0x4000000040000000;
    auVar8._12_4_ = 0x40000000;
    auVar3._8_4_ = 0xbf800000;
    auVar3._0_8_ = 0xbf800000bf800000;
    auVar3._12_4_ = 0xbf800000;
    auVar8 = vfmadd213ps_avx512vl(auVar8,auVar9,auVar3);
    auVar12._8_4_ = 0x7fffffff;
    auVar12._0_8_ = 0x7fffffff7fffffff;
    auVar12._12_4_ = 0x7fffffff;
    auVar9 = vandps_avx(auVar8,auVar12);
    auVar4 = vshufps_avx(auVar9,auVar9,0xf5);
    auVar13 = ZEXT416((uint)(1.0 - (auVar9._0_4_ + auVar4._0_4_)));
    auVar3 = vandps_avx(auVar13,auVar12);
    iVar7 = vmovmskps_avx(auVar13);
    fVar2 = 1.0 - auVar3._0_4_;
    uVar5 = vcmpss_avx512f(ZEXT416((uint)fVar2),ZEXT816(0),0);
    bVar6 = (bool)((byte)uVar5 & 1);
    x = (Float)((uint)bVar6 * 0x3f800000 +
               (uint)!bVar6 * (int)((auVar4._0_4_ - auVar9._0_4_) / fVar2 + 1.0));
    auVar9 = vmaxss_avx(ZEXT416((uint)(2.0 - fVar2 * fVar2)),ZEXT816(0));
    auVar9 = vsqrtss_avx(auVar9,auVar9);
    fVar1 = fVar2 * auVar9._0_4_;
    FVar10 = ApproxCos(x);
    auVar11._0_4_ = ApproxSin(x);
    auVar11._4_60_ = extraout_var;
    auVar9._4_4_ = extraout_XMM0_Db;
    auVar9._0_4_ = FVar10;
    auVar9._8_4_ = extraout_XMM0_Dc;
    auVar9._12_4_ = extraout_XMM0_Dd;
    auVar9 = vinsertps_avx(auVar9,auVar11._0_16_,0x10);
    auVar4._8_4_ = 0x80000000;
    auVar4._0_8_ = 0x8000000080000000;
    auVar4._12_4_ = 0x80000000;
    auVar9 = vpternlogd_avx512vl(auVar9,auVar8,auVar4,0x78);
    VVar14.super_Tuple3<pbrt::Vector3,_float>.x = fVar1 * auVar9._0_4_;
    VVar14.super_Tuple3<pbrt::Vector3,_float>.y = fVar1 * auVar9._4_4_;
    VVar14.super_Tuple3<pbrt::Vector3,_float>.z =
         (float)((uint)(1.0 - fVar2 * fVar2) ^ iVar7 << 0x1f);
    return (Vector3f)VVar14.super_Tuple3<pbrt::Vector3,_float>;
  }
  LogFatal<char_const(&)[45]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math.cpp"
             ,0x148,"Check failed: %s",(char (*) [45])"p.x >= 0 && p.x <= 1 && p.y >= 0 && p.y <= 1"
            );
}

Assistant:

Vector3f EqualAreaSquareToSphere(const Point2f &p) {
    CHECK(p.x >= 0 && p.x <= 1 && p.y >= 0 && p.y <= 1);

    // Transform p from [0,1] to [-1,1]
    Float u = 2 * p.x - 1, v = 2 * p.y - 1;

    // Take the absolute values to move u,v to the first quadrant
    Float au = std::abs(u), av = std::abs(v);

    // Compute the radius based on the signed distance along the diagonal
    Float sd = 1 - (au + av);
    Float d = std::abs(sd);
    Float r = 1 - d;

    // Compute phi*2/pi based on u, v and r (avoid div-by-zero if r=0)
    Float phi = r == 0 ? 1 : (av - au) / r + 1;  // phi = [0,2)

    // Compute the z coordinate (flip sign based on signed distance)
    Float r2 = r * r;
    Float z = 1 - r2;

    // Return a float with a's magnitude, but negated if b is negative.
    auto FlipSign = [](Float a, Float b) {
        return BitsToFloat(FloatToBits(a) ^ SignBit(b));
    };
    z = FlipSign(z, sd);
    Float sinTheta = r * SafeSqrt(2 - r2);

    // Flip signs of sin/cos based on signs of u,v
    Float cosPhi = FlipSign(ApproxCos(phi), u);
    Float sinPhi = FlipSign(ApproxSin(phi), v);

    return {sinTheta * cosPhi, sinTheta * sinPhi, z};
}